

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O2

void addIconFiles<int>(QStringView prefix,initializer_list<int> sizes,QIcon *icon,Mode mode,
                      State state)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  int local_f0;
  int local_ec;
  QArrayDataPointer<char16_t> local_e8;
  QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString> local_c8;
  QStringBuilder<QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString>,_QLatin1String>
  local_a8;
  QArrayDataPointer<char16_t> local_78;
  QStringBuilder<QLatin1String,_QStringView_&> local_60;
  QStringView prefix_local;
  
  prefix_local.m_data = prefix.m_data;
  prefix_local.m_size = prefix.m_size;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.b = &prefix_local;
  local_60.a.m_size = 0x2b;
  local_60.a.m_data = ":/qt-project.org/styles/commonstyle/images/";
  for (lVar3 = 0; sizes._M_len << 2 != lVar3; lVar3 = lVar3 + 4) {
    iVar1 = *(int *)((long)sizes._M_array + lVar3);
    QString::number((int)&local_e8,iVar1);
    local_c8.b.d.size = local_e8.size;
    local_c8.b.d.ptr = local_e8.ptr;
    local_c8.b.d.d = local_e8.d;
    local_c8.a = &local_60;
    local_e8.d = (Data *)0x0;
    local_e8.ptr = (char16_t *)0x0;
    local_e8.size = 0;
    QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString>::QStringBuilder
              (&local_a8.a,&local_c8);
    local_a8.b.m_size = 4;
    local_a8.b.m_data = ".png";
    QStringBuilder<QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString>,_QLatin1String>
    ::convertTo<QString>((QString *)&local_78,&local_a8);
    local_f0 = iVar1;
    local_ec = iVar1;
    QIcon::addFile((QString *)icon,(QSize *)&local_78,(Mode)&local_f0,mode);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8.a.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addIconFiles(QStringView prefix, std::initializer_list<T> sizes, QIcon &icon,
                         QIcon::Mode mode = QIcon::Normal, QIcon::State state = QIcon::Off)
{
    const auto fullPrefix = iconResourcePrefix() + prefix;
    for (int size : sizes)
        icon.addFile(fullPrefix + QString::number(size) + iconPngSuffix(),
                     QSize(size, size), mode, state);
}